

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_next(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  int local_34;
  int more;
  StkId t;
  int idx_local;
  lua_State *L_local;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5dd,"int lua_next(lua_State *, int)");
  }
  pTVar2 = index2addr(L,idx);
  if ((pTVar2->tt_ & 0xf) != 5) {
    __assert_fail("((((((((t))->tt_)) & 0x0F)) == (5))) && \"table expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5df,"int lua_next(lua_State *, int)");
  }
  if (pTVar2->tt_ == 0x8005) {
    if (pTVar2->tt_ != 0x8005) {
      __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x5e0,"int lua_next(lua_State *, int)");
    }
    if (((pTVar2->value_).gc)->tt != '\x05') {
      __assert_fail("(((t)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x5e0,"int lua_next(lua_State *, int)");
    }
    local_34 = luaH_next(L,(Table *)(pTVar2->value_).gc,L->top + -1);
  }
  else {
    if ((pTVar2->tt_ != 0x8015) && (pTVar2->tt_ != 0x8025)) {
      __assert_fail("(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x5e0,"int lua_next(lua_State *, int)");
    }
    if ((((pTVar2->value_).gc)->tt != '\x15') && (((pTVar2->value_).gc)->tt != '%')) {
      __assert_fail("((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x5e0,"int lua_next(lua_State *, int)");
    }
    local_34 = raviH_next(L,(RaviArray *)(pTVar2->value_).gc,L->top + -1);
  }
  if (local_34 == 0) {
    L->top = L->top + -1;
  }
  else {
    L->top = L->top + 1;
    if (L->ci->top < L->top) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x5e2,"int lua_next(lua_State *, int)");
    }
  }
  iVar1 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar1;
  if (iVar1 == 0) {
    return local_34;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x5e6,"int lua_next(lua_State *, int)");
}

Assistant:

LUA_API int lua_next (lua_State *L, int idx) {
  StkId t;
  int more;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  more = ttisLtable(t) ? luaH_next(L, hvalue(t), L->top - 1) : raviH_next(L, arrvalue(t), L->top - 1);
  if (more) {
    api_incr_top(L);
  }
  else  /* no more elements */
    L->top -= 1;  /* remove key */
  lua_unlock(L);
  return more;
}